

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void Diligent::PipelineStateUtils::
     ExtractShaders<Diligent::ShaderVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
               (RayTracingPipelineStateCreateInfo *CreateInfo,
               vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
               *ShaderStages,bool WaitUntilShadersReady,SHADER_TYPE *ActiveShaderStages)

{
  Int32 IVar1;
  size_t sVar2;
  iterator __position;
  char (*Args_1) [22];
  long lVar3;
  Uint32 i;
  ulong uVar4;
  anon_class_32_4_a6542874 AddShader;
  string msg_1;
  unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
  UniqueShaders;
  
  Args_1 = (char (*) [22])ActiveShaderStages;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_RAY_TRACING)
  {
    FormatString<char[26],char[42]>
              ((string *)&UniqueShaders,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsRayTracingPipeline()",
               (char (*) [42])ActiveShaderStages);
    Args_1 = (char (*) [22])0x118;
    DebugAssertionFailed
              ((Char *)UniqueShaders._M_h._M_buckets,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x118);
    std::__cxx11::string::~string((string *)&UniqueShaders);
  }
  UniqueShaders._M_h._M_buckets = &UniqueShaders._M_h._M_single_bucket;
  UniqueShaders._M_h._M_bucket_count = 1;
  UniqueShaders._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  UniqueShaders._M_h._M_element_count = 0;
  UniqueShaders._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  UniqueShaders._M_h._M_rehash_policy._M_next_resize = 0;
  UniqueShaders._M_h._M_single_bucket = (__node_base_ptr)0x0;
  AddShader.UniqueShaders = &UniqueShaders;
  AddShader.ShaderStages = ShaderStages;
  AddShader.ActiveShaderStages = ActiveShaderStages;
  AddShader.WaitUntilShadersReady = WaitUntilShadersReady;
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::clear(ShaderStages);
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::resize(ShaderStages,6);
  *ActiveShaderStages = SHADER_TYPE_UNKNOWN;
  lVar3 = 8;
  for (uVar4 = 0; uVar4 < CreateInfo->GeneralShaderCount; uVar4 = uVar4 + 1) {
    ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,*(IShader **)((long)&CreateInfo->pGeneralShaders->Name + lVar3));
    lVar3 = lVar3 + 0x10;
  }
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < CreateInfo->TriangleHitShaderCount; uVar4 = uVar4 + 1) {
    ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pClosestHitShader + lVar3));
    ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pAnyHitShader + lVar3));
    lVar3 = lVar3 + 0x18;
  }
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < CreateInfo->ProceduralHitShaderCount; uVar4 = uVar4 + 1) {
    ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pIntersectionShader + lVar3))
    ;
    ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pClosestHitShader + lVar3));
    ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pAnyHitShader + lVar3));
    lVar3 = lVar3 + 0x20;
  }
  IVar1 = GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN,PIPELINE_TYPE_RAY_TRACING);
  sVar2 = PipelineStateVkImpl::ShaderStageInfo::Count
                    ((ShaderStages->
                     super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                     )._M_impl.super__Vector_impl_data._M_start + IVar1);
  if (sVar2 == 0) {
    Args_1 = (char (*) [22])0x142;
    LogError<true,char[68]>
              (false,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x142,(char (*) [68])
                      "At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");
  }
  __position._M_current =
       (ShaderStages->
       super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
       )._M_impl.super__Vector_impl_data._M_start;
  while (__position._M_current !=
         (ShaderStages->
         super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
         )._M_impl.super__Vector_impl_data._M_finish) {
    sVar2 = PipelineStateVkImpl::ShaderStageInfo::Count(__position._M_current);
    if (sVar2 == 0) {
      __position = std::
                   vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                   ::erase(ShaderStages,__position._M_current);
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  if ((ShaderStages->
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      )._M_impl.super__Vector_impl_data._M_start == __position._M_current) {
    FormatString<char[26],char[22]>
              (&msg_1,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",Args_1);
    DebugAssertionFailed
              (msg_1._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x151);
    std::__cxx11::string::~string((string *)&msg_1);
  }
  std::
  _Hashtable<Diligent::IShader_*,_Diligent::IShader_*,_std::allocator<Diligent::IShader_*>,_std::__detail::_Identity,_std::equal_to<Diligent::IShader_*>,_std::hash<Diligent::IShader_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&UniqueShaders._M_h);
  return;
}

Assistant:

void ExtractShaders(const RayTracingPipelineStateCreateInfo& CreateInfo,
                    TShaderStages&                           ShaderStages,
                    bool                                     WaitUntilShadersReady,
                    SHADER_TYPE&                             ActiveShaderStages)
{
    VERIFY_EXPR(CreateInfo.PSODesc.IsRayTracingPipeline());

    std::unordered_set<IShader*> UniqueShaders;

    auto AddShader = [&ShaderStages,
                      &UniqueShaders,
                      &ActiveShaderStages,
                      WaitUntilShadersReady](IShader* pShader) {
        if (pShader != nullptr && UniqueShaders.insert(pShader).second)
        {
            const SHADER_TYPE ShaderType = pShader->GetDesc().ShaderType;
            const Int32       StageInd   = GetShaderTypePipelineIndex(ShaderType, PIPELINE_TYPE_RAY_TRACING);
            auto&             Stage      = ShaderStages[StageInd];
            ActiveShaderStages |= ShaderType;
            RefCntAutoPtr<ShaderImplType> pShaderImpl{pShader, ShaderImplType::IID_InternalImpl};
            VERIFY(pShaderImpl, "Unexpected shader object implementation");
            WaitUntilShaderReadyIfRequested(pShaderImpl, WaitUntilShadersReady);
            Stage.Append(pShaderImpl);
        }
    };

    ShaderStages.clear();
    ShaderStages.resize(MAX_SHADERS_IN_PIPELINE);
    ActiveShaderStages = SHADER_TYPE_UNKNOWN;

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        AddShader(CreateInfo.pGeneralShaders[i].pShader);
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pTriangleHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pTriangleHitShaders[i].pAnyHitShader);
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pProceduralHitShaders[i].pIntersectionShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pAnyHitShader);
    }

    if (ShaderStages[GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN, PIPELINE_TYPE_RAY_TRACING)].Count() == 0)
        LOG_ERROR_AND_THROW("At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");

    // Remove empty stages
    for (auto iter = ShaderStages.begin(); iter != ShaderStages.end();)
    {
        if (iter->Count() == 0)
        {
            iter = ShaderStages.erase(iter);
        }
        else
        {
            ++iter;
        }
    }

    VERIFY_EXPR(!ShaderStages.empty());
}